

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<fmt::v5::basic_string_view<char>,char[3]>
          (char *expected_expression,char *actual_expression,basic_string_view<char> *expected,
          char (*actual) [3])

{
  basic_string_view<char> rhs;
  bool bVar1;
  undefined8 *in_RCX;
  basic_string_view<char> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string_view<char> *in_RDI;
  char *in_R8;
  AssertionResult AVar3;
  char *in_stack_ffffffffffffff48;
  basic_string_view<char> *in_stack_ffffffffffffff50;
  basic_string_view<char> *pbVar4;
  basic_string_view<char> in_stack_ffffffffffffff68;
  string local_88 [32];
  string local_68 [39];
  undefined1 in_stack_ffffffffffffffbf;
  string *in_stack_ffffffffffffffc0;
  string *expected_value;
  char *actual_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  expected_value = (string *)*in_RCX;
  actual_expression_00 = (char *)in_RCX[1];
  pbVar4 = in_RDI;
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  rhs.size_ = (size_t)pbVar4;
  rhs.data_ = (char *)in_RDI;
  bVar1 = fmt::v5::operator==(in_stack_ffffffffffffff68,rhs);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    FormatForComparisonFailureMessage<fmt::v5::basic_string_view<char>,char[3]>
              (in_RDI,(char (*) [3])in_RDX);
    FormatForComparisonFailureMessage<char[3],fmt::v5::basic_string_view<char>>
              ((char (*) [3])in_RDI,in_RDX);
    EqFailure(in_R8,actual_expression_00,expected_value,in_stack_ffffffffffffffc0,
              (bool)in_stack_ffffffffffffffbf);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = pbVar4;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}